

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O3

digits_t icu_63::number::impl::roundingutils::doubleFractionLength(double input)

{
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [18];
  bool local_31;
  short local_30 [2];
  short local_2c [2];
  char local_28 [24];
  
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (input,SHORTEST,0,local_28,0x12,&local_31,(int *)local_2c,(int *)local_30);
  return local_2c[0] - local_30[0];
}

Assistant:

digits_t roundingutils::doubleFractionLength(double input) {
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 1];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
            input,
            DoubleToStringConverter::DtoaMode::SHORTEST,
            0,
            buffer,
            sizeof(buffer),
            &sign,
            &length,
            &point
    );

    return static_cast<digits_t>(length - point);
}